

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall
ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream
          (basic_ofstream<char,_std::char_traits<char>_> *this,path *p,openmode mode)

{
  string local_40;
  
  std::ios_base::ios_base
            ((ios_base *)
             &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  *(code **)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).
             super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       std::__basic_file<char>::is_open;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1d0 = 0;
  *(undefined2 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1d8 = 0;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1e0 = 0;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1e8 = 0;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1f0 = 0;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x1f8 = 0;
  path::string_abi_cxx11_(&local_40,p);
  std::ofstream::ofstream
            ((ofstream *)this,(char *)&PTR_construction_vtable_24__001be7b8,
             (_Ios_Openmode)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_basic_ofstream<char,_std::char_traits<char>_>).
  super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x1be778;
  *(undefined8 *)
   &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
    super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 = 0x1be7a0;
  return;
}

Assistant:

explicit basic_ofstream(const path& p, std::ios_base::openmode mode = std::ios_base::out)
        : std::basic_ofstream<charT, traits>(p.string().c_str(), mode)
    {
    }